

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int mg_is_error(int n)

{
  int *piVar1;
  undefined1 local_e;
  undefined1 local_d;
  int n_local;
  
  local_d = true;
  if (n != 0) {
    local_e = false;
    if (n < 0) {
      piVar1 = __errno_location();
      local_e = false;
      if (*piVar1 != 4) {
        piVar1 = __errno_location();
        local_e = false;
        if (*piVar1 != 0x73) {
          piVar1 = __errno_location();
          local_e = false;
          if (*piVar1 != 0xb) {
            piVar1 = __errno_location();
            local_e = *piVar1 != 0xb;
          }
        }
      }
    }
    local_d = local_e;
  }
  return (int)local_d;
}

Assistant:

int mg_is_error(int n) {
#ifdef MG_CC3200
                                                                                                                            DBG(("n = %d, errno = %d", n, errno));
  if (n < 0) errno = n;
#endif
    return n == 0 || (n < 0 && errno != EINTR && errno != EINPROGRESS &&
                      errno != EAGAIN && errno != EWOULDBLOCK
#ifdef MG_CC3200
            && errno != SL_EALREADY
#endif
#ifdef _WIN32
                                                                                                                            && WSAGetLastError() != WSAEINTR &&
                    WSAGetLastError() != WSAEWOULDBLOCK
#endif
    );
}